

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

void __thiscall QHttpNetworkReplyPrivate::~QHttpNetworkReplyPrivate(QHttpNetworkReplyPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  
  *(undefined ***)this = &PTR__QHttpNetworkReplyPrivate_002ceb38;
  QUrl::~QUrl(&this->redirectUrl);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer
            ((QArrayDataPointer<QByteArray> *)&this->responseData);
  pDVar3 = (this->connectionChannel).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar3 = (this->connectionChannel).wp.d;
      if (pDVar3 == (Data *)0x0) {
        pDVar3 = (Data *)0x0;
      }
      operator_delete(pDVar3);
    }
  }
  pDVar3 = (this->connection).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar3 = (this->connection).wp.d;
      if (pDVar3 == (Data *)0x0) {
        pDVar3 = (Data *)0x0;
      }
      operator_delete(pDVar3);
    }
  }
  pDVar1 = (this->fragment).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->fragment).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar2 = (this->errorString).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->errorString).d.d)->super_QArrayData,2,0x10);
    }
  }
  QHttpNetworkRequest::~QHttpNetworkRequest(&this->request);
  pDVar2 = (this->super_QHttpNetworkHeaderPrivate).parser.reasonPhrase.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QHttpNetworkHeaderPrivate).parser.reasonPhrase.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  QHttpHeaders::~QHttpHeaders(&(this->super_QHttpNetworkHeaderPrivate).parser.fields);
  QUrl::~QUrl(&(this->super_QHttpNetworkHeaderPrivate).url);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QHttpNetworkReplyPrivate::~QHttpNetworkReplyPrivate() = default;